

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_poly.c
# Opt level: O0

mpt_value * iterPolyValue(mpt_iterator *it)

{
  _mpt_vptr_iterator *p_Var1;
  long lVar2;
  int local_6c;
  int k;
  double tmp;
  double prod;
  coeff_poly *coeff;
  double *src;
  long j;
  long max;
  double val;
  double sum;
  mpt_buffer *buf;
  mpt_iteratorPolynom *d;
  mpt_iterator *it_local;
  
  p_Var1 = it[4]._vptr;
  if (p_Var1 == (_mpt_vptr_iterator *)0x0) {
    if (0xfffffffe < (long)it[5]._vptr) {
      return (mpt_value *)0x0;
    }
    max = (long)(double)(long)it[5]._vptr;
  }
  else {
    if ((long)((ulong)p_Var1[1].value >> 3) <= (long)it[5]._vptr) {
      return (mpt_value *)0x0;
    }
    max = (long)(&p_Var1[1].advance)[(long)it[5]._vptr];
  }
  if (it[2]._vptr == (_mpt_vptr_iterator *)0x0) {
    lVar2 = (long)*(int *)&it[6]._vptr;
    if (lVar2 == 0) {
      val = (double)max;
    }
    else {
      val = 0.0;
      for (src = (double *)0x0; (long)src < lVar2; src = (double *)((long)src + 1)) {
        local_6c = (int)src;
        tmp = (double)it[(long)src * 2 + 8]._vptr;
        while (local_6c = local_6c + 1, local_6c < lVar2) {
          tmp = ((double)it[(long)src * 2 + 7]._vptr + (double)max) * tmp;
        }
        val = tmp + val;
      }
    }
    it[3]._vptr = (_mpt_vptr_iterator *)val;
    it[1]._vptr = (_mpt_vptr_iterator *)(it + 3);
    it[2]._vptr = (_mpt_vptr_iterator *)0x64;
  }
  it_local = it + 1;
  return (mpt_value *)it_local;
}

Assistant:

static const MPT_STRUCT(value) *iterPolyValue(MPT_INTERFACE(iterator) *it)
{
	MPT_STRUCT(iteratorPolynom) *d = MPT_baseaddr(iteratorPolynom, it, _it);
	MPT_STRUCT(buffer) *buf;
	double sum, val;
	long max, j;
	
	/* check limits and set initial value */
	if ((buf = d->grid._buf)) {
		const double *src = (void *) (buf + 1);
		max = buf->_used / sizeof(double);
		if (d->pos >= max) {
			return 0;
		}
		val = src[d->pos];
	}
	else if (d->pos >= UINT_MAX) {
		return 0;
	}
	else {
		val = d->pos;
	}
	/* reuse calculations of previous call */
	if (d->val._type) {
		return &d->val;
	}
	/* no coefficients */
	if (!(max = d->coeff)) {
		sum = val;
	}
	/* calculate polynom */
	else {
		const struct coeff_poly *coeff = (void *) (d + 1);
		for (j = 0, sum = 0.0; j < max; j++) {
			double prod, tmp = val;
			int k;
			
			tmp += coeff[j].shift;
			
			for (k = j + 1, prod = coeff[j].mult; k < max; k++) {
				prod *= tmp;
			}
			sum += prod;
		}
	}
	/* assign new value */
	d->curr = sum;
	MPT_value_set(&d->val, 'd', &d->curr);
	
	return &d->val;
}